

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationFractionalSpacingTests.cpp
# Opt level: O0

vector<float,_std::allocator<float>_> *
vkt::tessellation::anon_unknown_0::readFloatArray
          (vector<float,_std::allocator<float>_> *__return_storage_ptr__,int count,void *memory,
          int offset)

{
  void *src;
  reference dst;
  float *pFloatData;
  allocator<float> local_26;
  undefined1 local_25;
  int local_24;
  void *pvStack_20;
  int offset_local;
  void *memory_local;
  vector<float,_std::allocator<float>_> *pvStack_10;
  int count_local;
  vector<float,_std::allocator<float>_> *results;
  
  local_25 = 0;
  local_24 = offset;
  pvStack_20 = memory;
  memory_local._4_4_ = count;
  pvStack_10 = __return_storage_ptr__;
  std::allocator<float>::allocator(&local_26);
  std::vector<float,_std::allocator<float>_>::vector(__return_storage_ptr__,(long)count,&local_26);
  std::allocator<float>::~allocator(&local_26);
  src = (void *)((long)pvStack_20 + (long)local_24);
  dst = std::vector<float,_std::allocator<float>_>::operator[](__return_storage_ptr__,0);
  ::deMemcpy(dst,src,(long)memory_local._4_4_ << 2);
  return __return_storage_ptr__;
}

Assistant:

std::vector<float> readFloatArray(const int count, const void* memory, const int offset)
{
	std::vector<float> results(count);

	const float* pFloatData = reinterpret_cast<const float*>(static_cast<const deUint8*>(memory) + offset);
	deMemcpy(&results[0], pFloatData, sizeof(float) * count);

	return results;
}